

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O1

void __thiscall
libtorrent::dht_stats_alert::dht_stats_alert
          (dht_stats_alert *this,stack_allocator *param_1,
          vector<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
          *table,vector<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_> *requests)

{
  rep rVar1;
  
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__alert_0045fff0;
  rVar1 = std::chrono::_V2::system_clock::now();
  (this->super_alert).m_timestamp.__d.__r = rVar1;
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__dht_stats_alert_004617e8;
  (this->active_requests).
  super__Vector_base<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>._M_impl.
  super__Vector_impl_data._M_start =
       (requests->
       super__Vector_base<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->active_requests).
  super__Vector_base<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (requests->
       super__Vector_base<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  (this->active_requests).
  super__Vector_base<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (requests->
       super__Vector_base<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (requests->super__Vector_base<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (requests->super__Vector_base<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (requests->super__Vector_base<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->routing_table).
  super__Vector_base<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (table->
       super__Vector_base<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->routing_table).
  super__Vector_base<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (table->
       super__Vector_base<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  (this->routing_table).
  super__Vector_base<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (table->
       super__Vector_base<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (table->
  super__Vector_base<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (table->
  super__Vector_base<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (table->
  super__Vector_base<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

dht_stats_alert::dht_stats_alert(aux::stack_allocator&
		, std::vector<dht_routing_bucket> table
		, std::vector<dht_lookup> requests)
		: alert()
		, active_requests(std::move(requests))
		, routing_table(std::move(table))
	{}